

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  HasBits<1> *pHVar1;
  ushort *puVar2;
  MethodDescriptor *pMVar3;
  FeatureSet *from;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar4;
  ServiceOptions *pSVar5;
  FeatureSet *pFVar6;
  Arena *pAVar7;
  long lVar8;
  long lVar9;
  string_view value;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar2 + ~value._M_len);
  pAVar7 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar7);
  if (0 < this->method_count_) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pMVar3 = this->methods_;
      proto_00 = (MethodDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::MethodDescriptorProto>);
      MethodDescriptor::CopyTo((MethodDescriptor *)(&pMVar3->super_SymbolBase + lVar9),proto_00);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x50;
    } while (lVar8 < this->method_count_);
  }
  pSVar5 = this->options_;
  if (pSVar5 != (ServiceOptions *)_ServiceOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (ServiceOptions *)0x0) {
      pAVar7 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      pSVar4 = (ServiceOptions *)Arena::DefaultConstruct<google::protobuf::ServiceOptions>(pAVar7);
      (proto->field_0)._impl_.options_ = pSVar4;
    }
    ServiceOptions::CopyFrom((proto->field_0)._impl_.options_,pSVar5);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (ServiceOptions *)0x0) {
      pAVar7 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      pSVar5 = (ServiceOptions *)Arena::DefaultConstruct<google::protobuf::ServiceOptions>(pAVar7);
      (proto->field_0)._impl_.options_ = pSVar5;
    }
    pSVar5 = (proto->field_0)._impl_.options_;
    pHVar1 = &(pSVar5->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
    if ((pSVar5->field_0)._impl_.features_ == (FeatureSet *)0x0) {
      pAVar7 = (Arena *)(pSVar5->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      pFVar6 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar7);
      (pSVar5->field_0)._impl_.features_ = pFVar6;
    }
    FeatureSet::CopyFrom((pSVar5->field_0)._impl_.features_,from);
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}